

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

Input * __thiscall
helics::ValueFederate::registerSubscription
          (ValueFederate *this,string_view target,string_view units)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Input *this_00;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_58[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_38;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_58;
  local_48 = &local_38;
  this_00 = ValueFederateManager::registerInput
                      ((this->vfManager)._M_t.
                       super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                       .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                       (string_view)(auVar1 << 0x40),(string_view)(auVar2 << 0x40),units);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  Input::addPublication(this_00,target);
  return this_00;
}

Assistant:

Input& ValueFederate::registerSubscription(std::string_view target, std::string_view units)
{
    auto& inp = vfManager->registerInput(std::string{}, std::string{}, units);
    inp.addTarget(target);
    return inp;
}